

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

CTcPrsNode * __thiscall
CTPNArglistBase::adjust_for_dyn(CTPNArglistBase *this,tcpn_dyncomp_info *info)

{
  CTPNArg *pCVar1;
  
  for (pCVar1 = this->list_; pCVar1 != (CTPNArg *)0x0;
      pCVar1 = (pCVar1->super_CTPNArgBase).next_arg_) {
    (*(pCVar1->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x11])
              (pCVar1,info);
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNArglistBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust each argument list member */
    CTPNArg *arg;
    for (arg = list_ ; arg != 0 ; arg = arg->get_next_arg())
    {
        /* 
         *   adjust this argument; assume the argument node itself isn't
         *   affected 
         */
        arg->adjust_for_dyn(info);
    }

    /* return myself otherwise unchanged */
    return this;
}